

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

float gimage::getMutualInformationU8
                (ImageFloat *mi,ImageU8 *image1,ImageU8 *image2,ImageFloat *disp,int channel)

{
  uchar ***pppuVar1;
  uchar ***pppuVar2;
  uchar *puVar3;
  uchar *puVar4;
  float **ppfVar5;
  int iVar6;
  float *pfVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  float ***pppfVar13;
  long lVar14;
  float ***pppfVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  GaussKernel gk;
  ImageFloat P;
  ImageFloat Pg1;
  ImageFloat P1;
  ImageFloat Pg;
  double local_158;
  GaussKernel local_148;
  ImageU8 *local_138;
  float ***local_130;
  float local_124;
  ImageFloat *local_120;
  float ***local_118;
  Image<float,_gimage::PixelTraits<float>_> local_110;
  Image<float,_gimage::PixelTraits<float>_> local_d8;
  Image<float,_gimage::PixelTraits<float>_> local_a0;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_110.depth = 0;
  local_110.width = 0;
  local_110.height = 0;
  local_110.n = 0;
  local_110.pixel = (float *)0x0;
  local_110.row = (float **)0x0;
  local_110.img = (float ***)0x0;
  local_138 = image2;
  local_120 = mi;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_110,0x100,0x100,1);
  if (local_110.n != 0) {
    lVar10 = -local_110.n;
    if (0 < local_110.n) {
      lVar10 = local_110.n;
    }
    memset(local_110.pixel,0,lVar10 << 2);
  }
  lVar10 = disp->width;
  if ((lVar10 < 1) || (pppfVar15 = (float ***)disp->height, (long)pppfVar15 < 1)) {
    lVar10 = image1->width;
    if (local_138->width < image1->width) {
      lVar10 = local_138->width;
    }
    lVar14 = image1->height;
    if (local_138->height < image1->height) {
      lVar14 = local_138->height;
    }
    local_130 = (float ***)CONCAT44(local_130._4_4_,local_110.depth);
    if (0 < local_110.depth) {
      iVar6 = 0;
      do {
        if (0 < lVar14) {
          pppuVar1 = image1->img;
          pppuVar2 = local_138->img;
          lVar11 = 0;
          do {
            if (0 < lVar10) {
              puVar3 = pppuVar1[channel][(int)lVar11];
              puVar4 = pppuVar2[channel][(int)lVar11];
              ppfVar5 = *local_110.img;
              lVar16 = 0;
              lVar9 = lVar10;
              do {
                ppfVar5[puVar4[lVar16 >> 0x20]][puVar3[lVar16 >> 0x20]] =
                     ppfVar5[puVar4[lVar16 >> 0x20]][puVar3[lVar16 >> 0x20]] + 1.0;
                lVar16 = lVar16 + 0x100000000;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != lVar14);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != local_110.depth);
    }
    local_124 = 1.0 / (float)(lVar14 * lVar10);
    operator*=(&local_110,(double)local_124);
  }
  else {
    lVar14 = image1->width;
    if (local_138->width < image1->width) {
      lVar14 = local_138->width;
    }
    if (lVar14 <= lVar10) {
      lVar10 = lVar14;
    }
    pppfVar13 = (float ***)image1->height;
    if (local_138->height < image1->height) {
      pppfVar13 = (float ***)local_138->height;
    }
    if ((long)pppfVar13 <= (long)pppfVar15) {
      pppfVar15 = pppfVar13;
    }
    if ((long)pppfVar13 < 1) {
      local_124 = 0.0;
    }
    else {
      local_118 = disp->img;
      lVar11 = 0;
      pppfVar13 = (float ***)0x0;
      do {
        if (0 < lVar14) {
          iVar6 = (int)pppfVar13;
          pfVar7 = (*local_118)[iVar6];
          pppuVar1 = local_138->img;
          pppuVar2 = image1->img;
          lVar9 = 0;
          lVar16 = 0;
          do {
            fVar19 = *(float *)((long)pfVar7 + (lVar9 >> 0x1e));
            if (((uint)ABS(fVar19) < 0x7f800000) && (fVar19 < (float)lVar16)) {
              fVar19 = (float)lVar16 - fVar19;
              fVar19 = fVar19 - (float)(long)fVar19;
              (*local_110.img)
              [(int)(((1.0 - fVar19) * (float)pppuVar1[channel][iVar6][lVar9 >> 0x20] +
                     fVar19 * (float)pppuVar1[channel][iVar6][lVar9 >> 0x20]) * 0.5 + 0.5)]
              [pppuVar2[channel][iVar6][lVar9 >> 0x20]] =
                   (*local_110.img)
                   [(int)(((1.0 - fVar19) * (float)pppuVar1[channel][iVar6][lVar9 >> 0x20] +
                          fVar19 * (float)pppuVar1[channel][iVar6][lVar9 >> 0x20]) * 0.5 + 0.5)]
                   [pppuVar2[channel][iVar6][lVar9 >> 0x20]] + 1.0;
              lVar11 = lVar11 + 1;
            }
            lVar16 = lVar16 + 1;
            lVar9 = lVar9 + 0x100000000;
          } while (lVar10 != lVar16);
        }
        pppfVar13 = (float ***)((long)pppfVar13 + 1);
      } while (pppfVar13 != pppfVar15);
      local_124 = (float)lVar11;
      local_130 = pppfVar15;
    }
    local_124 = 1.0 / local_124;
    operator*=(&local_110,(double)local_124);
  }
  if (0 < local_110.height) {
    lVar10 = 0;
    do {
      if (0 < local_110.width) {
        pfVar7 = (*local_110.img)[(int)lVar10];
        lVar11 = 0;
        lVar14 = local_110.width;
        do {
          fVar19 = *(float *)((long)pfVar7 + (lVar11 >> 0x1e));
          if ((fVar19 == 0.0) && (!NAN(fVar19))) {
            *(float *)((long)pfVar7 + (lVar11 >> 0x1e)) = local_124;
          }
          lVar11 = lVar11 + 0x100000000;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != local_110.height);
  }
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_68,0,0,1);
  gauss<float>(&local_68,&local_110,1.0);
  if (local_68.height < 1) {
    local_158 = 0.0;
  }
  else {
    pfVar7 = **local_68.img;
    local_158 = 0.0;
    lVar10 = 0;
    do {
      if (0 < local_68.width) {
        lVar14 = 0;
        do {
          fVar17 = logf(*pfVar7);
          fVar19 = *pfVar7;
          *pfVar7 = -fVar17;
          local_158 = local_158 - (double)(fVar17 * fVar19);
          pfVar7 = pfVar7 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < local_68.width);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_68.height);
  }
  gauss<float>(local_120,&local_68,1.0);
  local_a0.depth = 0;
  local_a0.width = 0;
  local_a0.height = 0;
  local_a0.n = 0;
  local_a0.pixel = (float *)0x0;
  local_a0.row = (float **)0x0;
  local_a0.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_a0,local_110.width,1,1);
  if (0 < local_110.width) {
    pfVar7 = **local_a0.img;
    lVar10 = 0;
    do {
      if (local_110.height < 1) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = 0.0;
        lVar11 = 0;
        lVar14 = local_110.height;
        do {
          fVar19 = fVar19 + *(float *)(*(long *)((long)*local_110.img + (lVar11 >> 0x1d)) +
                                      (long)(int)lVar10 * 4);
          lVar11 = lVar11 + 0x100000000;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      pfVar7[(int)lVar10] = fVar19;
      lVar10 = lVar10 + 1;
    } while (lVar10 != local_110.width);
  }
  local_148.kernel = (float *)0x0;
  local_148.kn = 0;
  local_148.kn2 = 0;
  GaussKernel::set(&local_148,1.0);
  local_d8.depth = 0;
  local_d8.width = 0;
  local_d8.height = 0;
  local_d8.n = 0;
  local_d8.pixel = (float *)0x0;
  local_d8.row = (float **)0x0;
  local_d8.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_d8,local_110.width,1,1);
  if (0 < local_a0.width) {
    pfVar7 = **local_d8.img;
    iVar6 = -local_148.kn2;
    lVar10 = 0;
    do {
      if (lVar10 < local_a0.width - local_148.kn2 && local_148.kn2 <= lVar10) {
        if (local_148.kn < 1) {
          fVar19 = 0.0;
        }
        else {
          fVar19 = 0.0;
          lVar14 = 0;
          do {
            fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_a0.img)[iVar6 + lVar14];
            lVar14 = lVar14 + 1;
          } while (local_148.kn != lVar14);
        }
      }
      else {
        fVar19 = NAN;
        if (0 < local_148.kn) {
          fVar17 = 0.0;
          lVar14 = 0;
          fVar19 = 0.0;
          do {
            uVar12 = iVar6 + (int)lVar14;
            if ((-1 < (int)uVar12) &&
               (uVar8 = (ulong)(uVar12 & 0x7fffffff), (long)uVar8 < local_a0.width)) {
              fVar17 = fVar17 + local_148.kernel[lVar14];
              fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_a0.img)[uVar8];
            }
            lVar14 = lVar14 + 1;
          } while (local_148.kn != lVar14);
          fVar19 = fVar19 / fVar17;
        }
      }
      pfVar7[(int)lVar10] = fVar19;
      lVar10 = lVar10 + 1;
      iVar6 = iVar6 + 1;
    } while (lVar10 != local_a0.width);
  }
  if (local_d8.width < 1) {
    local_138 = (ImageU8 *)0x0;
  }
  else {
    pfVar7 = **local_d8.img;
    local_138 = (ImageU8 *)0x0;
    lVar10 = 0;
    do {
      fVar17 = logf(pfVar7[lVar10]);
      fVar19 = pfVar7[lVar10];
      pfVar7[lVar10] = -fVar17;
      local_138 = (ImageU8 *)((double)local_138 - (double)(fVar17 * fVar19));
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_d8.width);
  }
  if (0 < local_d8.width) {
    local_130 = local_d8.img;
    pppfVar15 = local_120->img;
    iVar6 = -local_148.kn2;
    lVar10 = 0;
    do {
      if ((lVar10 < local_148.kn2) || (local_d8.width - local_148.kn2 <= lVar10)) {
        fVar19 = NAN;
        if (0 < local_148.kn) {
          fVar17 = 0.0;
          lVar14 = 0;
          fVar19 = 0.0;
          do {
            uVar12 = iVar6 + (int)lVar14;
            if ((-1 < (int)uVar12) &&
               (uVar8 = (ulong)(uVar12 & 0x7fffffff), (long)uVar8 < local_d8.width)) {
              fVar17 = fVar17 + local_148.kernel[lVar14];
              fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_d8.img)[uVar8];
            }
            lVar14 = lVar14 + 1;
          } while (local_148.kn != lVar14);
          fVar19 = fVar19 / fVar17;
        }
      }
      else if (local_148.kn < 1) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = 0.0;
        lVar14 = 0;
        do {
          fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_d8.img)[iVar6 + lVar14];
          lVar14 = lVar14 + 1;
        } while (local_148.kn != lVar14);
      }
      if (0 < local_110.height) {
        ppfVar5 = *pppfVar15;
        lVar9 = (long)(int)lVar10 * 4;
        lVar11 = 0;
        lVar14 = local_110.height;
        do {
          lVar16 = *(long *)((long)ppfVar5 + (lVar11 >> 0x1d));
          *(float *)(lVar16 + lVar9) = fVar19 - *(float *)(lVar16 + lVar9);
          lVar11 = lVar11 + 0x100000000;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      lVar10 = lVar10 + 1;
      iVar6 = iVar6 + 1;
    } while (lVar10 != local_d8.width);
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_a0,local_110.height,1,1);
  if (0 < local_110.height) {
    pfVar7 = **local_a0.img;
    lVar10 = 0;
    do {
      if (local_110.width < 1) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = 0.0;
        lVar11 = 0;
        lVar14 = local_110.width;
        do {
          fVar19 = fVar19 + *(float *)((long)(*local_110.img)[(int)lVar10] + (lVar11 >> 0x1e));
          lVar11 = lVar11 + 0x100000000;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      pfVar7[(int)lVar10] = fVar19;
      lVar10 = lVar10 + 1;
    } while (lVar10 != local_110.height);
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_d8,local_110.height,1,1);
  if (0 < local_d8.width) {
    pfVar7 = **local_d8.img;
    iVar6 = -local_148.kn2;
    lVar10 = 0;
    do {
      if ((lVar10 < local_148.kn2) || (local_a0.width - local_148.kn2 <= lVar10)) {
        fVar19 = NAN;
        if (0 < local_148.kn) {
          fVar17 = 0.0;
          lVar14 = 0;
          fVar19 = 0.0;
          do {
            uVar12 = iVar6 + (int)lVar14;
            if ((-1 < (int)uVar12) &&
               (uVar8 = (ulong)(uVar12 & 0x7fffffff), (long)uVar8 < local_a0.width)) {
              fVar17 = fVar17 + local_148.kernel[lVar14];
              fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_a0.img)[uVar8];
            }
            lVar14 = lVar14 + 1;
          } while (local_148.kn != lVar14);
          fVar19 = fVar19 / fVar17;
        }
      }
      else if (local_148.kn < 1) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = 0.0;
        lVar14 = 0;
        do {
          fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_a0.img)[iVar6 + lVar14];
          lVar14 = lVar14 + 1;
        } while (local_148.kn != lVar14);
      }
      pfVar7[(int)lVar10] = fVar19;
      lVar10 = lVar10 + 1;
      iVar6 = iVar6 + 1;
    } while (lVar10 != local_d8.width);
  }
  if (local_d8.width < 1) {
    dVar18 = 0.0;
  }
  else {
    pfVar7 = **local_d8.img;
    dVar18 = 0.0;
    lVar10 = 0;
    do {
      fVar17 = logf(pfVar7[lVar10]);
      fVar19 = pfVar7[lVar10];
      pfVar7[lVar10] = -fVar17;
      dVar18 = dVar18 - (double)(fVar17 * fVar19);
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_d8.width);
  }
  if (0 < local_d8.width) {
    local_130 = (float ***)(long)local_148.kn2;
    local_118 = local_d8.img;
    pppfVar15 = local_120->img;
    iVar6 = -local_148.kn2;
    lVar10 = 0;
    do {
      if ((lVar10 < (long)local_130) || (local_d8.width - (long)local_130 <= lVar10)) {
        fVar19 = NAN;
        if (0 < local_148.kn) {
          fVar17 = 0.0;
          lVar14 = 0;
          fVar19 = 0.0;
          do {
            uVar12 = iVar6 + (int)lVar14;
            if ((-1 < (int)uVar12) &&
               (uVar8 = (ulong)(uVar12 & 0x7fffffff), (long)uVar8 < local_d8.width)) {
              fVar17 = fVar17 + local_148.kernel[lVar14];
              fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_d8.img)[uVar8];
            }
            lVar14 = lVar14 + 1;
          } while (local_148.kn != lVar14);
          fVar19 = fVar19 / fVar17;
        }
      }
      else if (local_148.kn < 1) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = 0.0;
        lVar14 = 0;
        do {
          fVar19 = fVar19 + local_148.kernel[lVar14] * (**local_d8.img)[iVar6 + lVar14];
          lVar14 = lVar14 + 1;
        } while (local_148.kn != lVar14);
      }
      if (0 < local_110.width) {
        pfVar7 = (*pppfVar15)[(int)lVar10];
        lVar11 = 0;
        lVar14 = local_110.width;
        do {
          *(float *)((long)pfVar7 + (lVar11 >> 0x1e)) =
               *(float *)((long)pfVar7 + (lVar11 >> 0x1e)) + fVar19;
          lVar11 = lVar11 + 0x100000000;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      lVar10 = lVar10 + 1;
      iVar6 = iVar6 + 1;
    } while (lVar10 != local_d8.width);
  }
  operator*=(local_120,(double)local_124);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_d8);
  if (local_148.kernel != (float *)0x0) {
    operator_delete__(local_148.kernel);
  }
  dVar18 = (double)local_138 + dVar18;
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_a0);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_110);
  return (float)(dVar18 - local_158);
}

Assistant:

float getMutualInformationU8(ImageFloat &mi, const ImageU8 &image1, const ImageU8 &image2,
  const ImageFloat &disp, int channel)
{
  ImageFloat P(256, 256, 1);
  P=0;

  // For computation of mutual information, see Hirschmueller (2008, TPAMI) or
  // Hirschmueller (2005, CVPR).

  // compute joint probabilities P_I1,I2

  float scale; // 1/number_of_correspondences

  if (disp.getWidth() > 0 && disp.getHeight() > 0)
  {
    long width=std::min(std::min(image1.getWidth(), image2.getWidth()), disp.getWidth());
    long height=std::min(std::min(image1.getHeight(), image2.getHeight()), disp.getHeight());
    long n=0;

    for (long k=0; k<height; k++)
    {
      for (long i=0; i<width; i++)
      {
        float v=disp(i, k, 0);

        if (disp.isValidS(v) && v < i)
        {
          v=i-v; // pixel in right image
          long ii=static_cast<long>(v); // full pixel
          v-=ii; // fraction

          // get intensity frpm right image by linear interpolation
          v=0.5f*((1-v)*image2(i, k, channel)+v*image2(i, k, channel));

          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), static_cast<int>(v+0.5f))++;

          n++;
        }
      }
    }

    scale=1.0f/n;
    P*=scale;
  }
  else
  {
    long width=std::min(image1.getWidth(), image2.getWidth());
    long height=std::min(image1.getHeight(), image2.getHeight());

    for (int d=0; d<P.getDepth(); d++)
    {
      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), image2(i, k, channel))++;
        }
      }
    }

    scale=1.0f/(width*height);
    P*=scale;
  }

  // replace all cells with 0 by the smallest value to avoid computing log(0)

  for (long k=0; k<P.getHeight(); k++)
  {
    for (long i=0; i<P.getWidth(); i++)
    {
      if (P(i, k) == 0) P(i, k)=scale;
    }
  }

  // compute joint entropy h_I1,I2 = -Gauss_convolution(log(Gauss_convolution(P_I1,I2)))

  ImageFloat Pg;
  gauss(Pg, P, 1.0f);

  double entropy=0;
  float *pg=Pg.getPtr(0, 0);

  for (long k=0; k<Pg.getHeight(); k++)
  {
    for (long i=0; i<Pg.getWidth(); i++)
    {
      entropy+=negLog(*pg);
      pg++;
    }
  }

  gauss(mi, Pg, 1.0f);

  // sum over columns for getting probabilities of image1

  ImageFloat P1(P.getWidth(), 1, 1);

  for (long i=0; i<P.getWidth(); i++)
  {
    float sum=0;
    for (long k=0; k<P.getHeight(); k++) sum+=P(i, k);
    P1(i, 0)=sum;
  }

  // compute entropy for image1

  GaussKernel gk(1.0f);

  ImageFloat Pg1(P.getWidth(), 1, 1);
  for (long i=0; i<P1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy1=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy1+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to negative mi values

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    float v=gk.convolveHorizontal(Pg1, i, 0, 0);
    for (long k=0; k<P.getHeight(); k++) mi(i, k)=v-mi(i, k);
  }

  // sum over rows for getting probabilities of image1

  P1.setSize(P.getHeight(), 1, 1);

  for (long k=0; k<P.getHeight(); k++)
  {
    float sum=0;
    for (long i=0; i<P.getWidth(); i++) sum+=P(i, k);
    P1(k, 0)=sum;
  }

  // compute entropy for image2

  Pg1.setSize(P.getHeight(), 1, 1);
  for (long i=0; i<Pg1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy2=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy2+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to mi values

  for (long k=0; k<Pg1.getWidth(); k++)
  {
    float v=gk.convolveHorizontal(Pg1, k, 0, 0);
    for (long i=0; i<P.getWidth(); i++) mi(i, k)+=v;
  }

  // apply 1/n

  mi*=scale;

  return static_cast<float>(entropy1+entropy2-entropy);
}